

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integer_to_hex.hpp
# Opt level: O1

char * mserialize::detail::write_integer_as_hex<signed_char>(char v,char *end)

{
  char *pcVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  uVar4 = (uint)(byte)v;
  if (v == '\0') {
    end[-1] = '0';
    return end + -1;
  }
  if (v < '\x01') {
    pcVar1 = end + -1;
    do {
      uVar2 = (uint)(char)uVar4;
      uVar3 = uVar2;
      if ((char)uVar4 < '\0') {
        uVar3 = uVar2 + 0xf;
      }
      *pcVar1 = "0123456789ABCDEF"[-(long)((int)uVar2 % 0x10)];
      uVar4 = (int)uVar3 >> 4;
      pcVar1 = pcVar1 + -1;
    } while (0x1e < uVar2 + 0xf);
    *pcVar1 = '-';
    return pcVar1;
  }
  do {
    uVar2 = (uint)(char)uVar4;
    uVar3 = uVar2;
    if ((char)uVar4 < '\0') {
      uVar3 = uVar2 + 0xf;
    }
    end[-1] = "0123456789ABCDEF"[(int)uVar2 % 0x10];
    end = end + -1;
    uVar4 = (int)uVar3 >> 4;
  } while (0x1e < uVar2 + 0xf);
  return end;
}

Assistant:

constexpr char* write_integer_as_hex(Integer v, char* end)
{
  const char digits[] = "0123456789ABCDEF";

  if (v == 0)
  {
    *--end = '0';
  }
  else if (v > 0)
  {
    while (v != 0)
    {
      *--end = digits[v % 16];
      v = static_cast<Integer>(v / 16);
    }
  }
  else
  {
    while (v != 0)
    {
      *--end = digits[-(v % 16)];
      v = static_cast<Integer>(v / 16);
    }
    *--end = '-';
  }

  return end;
}